

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# MADEC-CORE.cpp
# Opt level: O2

void add2P(int v)

{
  int iVar1;
  int iVar2;
  ulong uVar3;
  long lVar4;
  int *piVar5;
  int *piVar6;
  ulong uVar7;
  ulong __position;
  long lVar8;
  ulong uVar9;
  
  __position = (ulong)v;
  std::bitset<15000UL>::set(&P,__position,true);
  sizeP = sizeP + 1;
  if ((Cp.super__Base_bitset<235UL>._M_w[__position >> 6] >> (__position & 0x3f) & 1) == 0) {
    std::bitset<15000UL>::reset(&Cm,__position);
    out_Cm(v);
  }
  else {
    std::bitset<15000UL>::reset(&Cp,__position);
    out_Cp(v);
  }
  sizeC = sizeC + -1;
  CE_P_P = CE_P_P + CE_P_[__position];
  lVar4 = (long)cnt_lP;
  cnt_lP = cnt_lP + 1;
  lP[lVar4] = v;
  piVar6 = AdjB;
  iVar1 = AdjP[__position + 1];
  for (lVar4 = (long)AdjP[__position]; lVar4 < iVar1; lVar4 = lVar4 + 1) {
    iVar2 = piVar6[lVar4];
    neiC[iVar2] = neiC[iVar2] + -1;
    neiP[iVar2] = neiP[iVar2] + 1;
  }
  lVar8 = (long)NAdjP[__position];
  piVar6 = NAdjB + lVar8;
  lVar4 = lVar8 * 4;
  piVar5 = NAdjB;
  for (; lVar4 = lVar4 + 4, lVar8 < NAdjP[__position + 1]; lVar8 = lVar8 + 1) {
    iVar1 = *piVar6;
    uVar7 = (ulong)iVar1;
    uVar3 = Cm.super__Base_bitset<235UL>._M_w[uVar7 >> 6];
    uVar9 = 1L << ((byte)iVar1 & 0x3f);
    if (((uVar3 >> (uVar7 & 0x3f) & 1) == 0) &&
       ((Cp.super__Base_bitset<235UL>._M_w[uVar7 >> 6] & uVar9) == 0)) {
      piVar6 = CE_P_ + uVar7;
    }
    else {
      CE_Cp_P = CE_Cp_P + 1;
      piVar6 = CE_P_ + uVar7;
      if (((uVar3 & uVar9) != 0) && (CE_P_[uVar7] == 0)) {
        add_from_Cm_to_Cp(iVar1);
        piVar5 = NAdjB;
      }
    }
    *piVar6 = *piVar6 + 1;
    piVar6 = (int *)((long)piVar5 + lVar4);
  }
  return;
}

Assistant:

inline void add2P(int v) {
    P.set(v); ++sizeP;
    if(Cp[v]) {Cp.reset(v); out_Cp(v);}
    else {Cm.reset(v); out_Cm(v);}
    --sizeC;

    CE_P_P += CE_P_[v];
    lP[cnt_lP++] = v;

    FOR_NA(v, u) {--neiC[u]; ++neiP[u];}

    FOR_C_NA(v, u) {
        if (Cm[u] || Cp[u]) ++CE_Cp_P;
        if (CE_P_[u] == 0 && Cm[u])
            add_from_Cm_to_Cp(u);
        ++CE_P_[u];
    }
}